

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

void __thiscall Pda::addNode(Pda *this,Node *n,bool start,bool end)

{
  undefined3 in_register_00000011;
  Node *local_20;
  
  local_20 = n;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back(&this->allNodes,&local_20);
  if (CONCAT31(in_register_00000011,start) != 0) {
    this->start = local_20;
  }
  if (end) {
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back(&this->endNodes,&local_20);
  }
  return;
}

Assistant:

void Pda::addNode(Tjen::Node *n, bool start, bool end) {
    this->allNodes.push_back(n);

    if(start){
        this->start = n;
    }
    if(end){
        this->endNodes.push_back(n);
    }
}